

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_sort.cpp
# Opt level: O3

LOs __thiscall Omega_h::sort_by_keys<int>(Omega_h *this,Read<int> *keys,Int width)

{
  double dVar1;
  _Iter_comp_iter<Omega_h::CompareKeySets<int,_3>_> __comp;
  _Iter_comp_iter<Omega_h::CompareKeySets<int,_4>_> __comp_00;
  _Iter_comp_iter<Omega_h::CompareKeySets<int,_1>_> __comp_01;
  _Iter_comp_iter<Omega_h::CompareKeySets<int,_2>_> __comp_02;
  long lVar2;
  long *plVar3;
  Alloc *pAVar4;
  _Alloc_hider _Var5;
  int *piVar6;
  Now NVar7;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *extraout_RDX_09;
  void *extraout_RDX_10;
  void *pvVar8;
  void *extraout_RDX_11;
  int *__last;
  int iVar9;
  size_t sVar10;
  Alloc *this_00;
  int iVar11;
  long lVar12;
  Real RVar13;
  pair<int_*,_long> pVar14;
  LOs LVar15;
  Write<int> perm;
  Write<int> local_a8;
  string local_90;
  Alloc *local_70;
  CompareKeySets<int,_4> local_68;
  Alloc *local_60;
  CompareKeySets<int,_3> local_58;
  Alloc *local_50;
  CompareKeySets<int,_2> local_48;
  Alloc *local_40;
  CompareKeySets<int,_1> local_38;
  
  switch(width) {
  case 1:
    local_40 = (keys->write_).shared_alloc_.alloc;
    if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_40 = (Alloc *)(local_40->size * 8 + 1);
      }
      else {
        local_40->use_count = local_40->use_count + 1;
      }
    }
    pAVar4 = local_40;
    __comp_01._M_comp.keys_ = (CompareKeySets<int,_1>)(keys->write_).shared_alloc_.direct_ptr;
    local_38.keys_ = (int *)__comp_01._M_comp.keys_;
    begin_code("sort_by_keys",(char *)0x0);
    if (((ulong)pAVar4 & 1) == 0) {
      sVar10 = pAVar4->size;
    }
    else {
      sVar10 = (ulong)pAVar4 >> 3;
    }
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    Write<int>::Write(&local_a8,(LO)(sVar10 >> 2),0,1,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    pvVar8 = local_a8.shared_alloc_.direct_ptr;
    begin_code("parallel_sort",(char *)0x0);
    lVar12 = (sVar10 >> 2) << 0x20;
    if (lVar12 != 0) {
      __last = (int *)((lVar12 >> 0x1e) + (long)pvVar8);
      pVar14 = std::get_temporary_buffer<int>
                         ((long)(int)(((lVar12 >> 0x20) - ((lVar12 >> 0x20) + 1 >> 0x3f)) + 1U >> 1)
                         );
      lVar12 = pVar14.second;
      piVar6 = pVar14.first;
      if (piVar6 == (int *)0x0) {
        lVar12 = 0;
        std::
        __inplace_stable_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<Omega_h::CompareKeySets<int,1>>>
                  ((int *)pvVar8,__last,__comp_01);
      }
      else {
        std::
        __stable_sort_adaptive<int*,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<Omega_h::CompareKeySets<int,1>>>
                  ((int *)pvVar8,__last,piVar6,lVar12,__comp_01);
      }
      operator_delete(piVar6,lVar12 << 2);
    }
    plVar3 = profile::global_singleton_history;
    if (profile::global_singleton_history != (long *)0x0) {
      dVar1 = *(double *)
               (*profile::global_singleton_history + 0x30 +
               profile::global_singleton_history[3] * 0x40);
      NVar7 = now();
      RVar13 = operator-(NVar7,(Impl)((Impl *)(*plVar3 + 0x28 + plVar3[3] * 0x40))->__d);
      lVar12 = *plVar3;
      lVar2 = plVar3[3];
      *(double *)(lVar12 + 0x30 + lVar2 * 0x40) = dVar1 + RVar13;
      plVar3[3] = *(long *)(lVar12 + lVar2 * 0x40);
      plVar3 = profile::global_singleton_history;
      if (profile::global_singleton_history != (long *)0x0) {
        dVar1 = *(double *)
                 (*profile::global_singleton_history + 0x30 +
                 profile::global_singleton_history[3] * 0x40);
        NVar7 = now();
        RVar13 = operator-(NVar7,(Impl)((Impl *)(*plVar3 + 0x28 + plVar3[3] * 0x40))->__d);
        lVar12 = *plVar3;
        lVar2 = plVar3[3];
        *(double *)(lVar12 + 0x30 + lVar2 * 0x40) = dVar1 + RVar13;
        plVar3[3] = *(long *)(lVar12 + lVar2 * 0x40);
      }
    }
    local_90._M_dataplus._M_p = (pointer)local_a8.shared_alloc_.alloc;
    local_90._M_string_length = (size_type)local_a8.shared_alloc_.direct_ptr;
    if ((((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
         local_a8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_a8.shared_alloc_.alloc)->use_count = (local_a8.shared_alloc_.alloc)->use_count + -1;
      local_90._M_dataplus._M_p = (pointer)((local_a8.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_a8.shared_alloc_.alloc = (Alloc *)0x0;
    local_a8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<int>::Read((Read<signed_char> *)this,(Write<int> *)&local_90);
    _Var5._M_p = local_90._M_dataplus._M_p;
    pvVar8 = extraout_RDX;
    if (((ulong)local_90._M_dataplus._M_p & 7) == 0 &&
        (Alloc *)local_90._M_dataplus._M_p != (Alloc *)0x0) {
      piVar6 = (int *)(local_90._M_dataplus._M_p + 0x30);
      *piVar6 = *piVar6 + -1;
      if (*piVar6 == 0) {
        Alloc::~Alloc((Alloc *)local_90._M_dataplus._M_p);
        operator_delete(_Var5._M_p,0x48);
        pvVar8 = extraout_RDX_00;
      }
    }
    pAVar4 = local_a8.shared_alloc_.alloc;
    this_00 = local_40;
    if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
        local_a8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar6 = &(local_a8.shared_alloc_.alloc)->use_count;
      *piVar6 = *piVar6 + -1;
      if (*piVar6 == 0) {
        Alloc::~Alloc(local_a8.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
        pvVar8 = extraout_RDX_01;
        this_00 = local_40;
      }
    }
    break;
  case 2:
    local_50 = (keys->write_).shared_alloc_.alloc;
    if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_50 = (Alloc *)(local_50->size * 8 + 1);
      }
      else {
        local_50->use_count = local_50->use_count + 1;
      }
    }
    pAVar4 = local_50;
    __comp_02._M_comp.keys_ = (CompareKeySets<int,_2>)(keys->write_).shared_alloc_.direct_ptr;
    local_48.keys_ = (int *)__comp_02._M_comp.keys_;
    begin_code("sort_by_keys",(char *)0x0);
    if (((ulong)pAVar4 & 1) == 0) {
      sVar10 = pAVar4->size;
    }
    else {
      sVar10 = (ulong)pAVar4 >> 3;
    }
    if (((uint)sVar10 >> 2 & 1) != 0) {
      fail("assertion %s failed at %s +%d\n","a % b == 0",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
           ,0x11a);
    }
    iVar9 = (int)(sVar10 >> 2);
    iVar11 = iVar9 >> 1;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    Write<int>::Write(&local_a8,iVar11,0,1,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    pvVar8 = local_a8.shared_alloc_.direct_ptr;
    begin_code("parallel_sort",(char *)0x0);
    if (iVar9 != 0) {
      pVar14 = std::get_temporary_buffer<int>((long)((iVar11 - (iVar11 + 1 >> 0x1f)) + 1 >> 1));
      lVar12 = pVar14.second;
      piVar6 = pVar14.first;
      if (piVar6 == (int *)0x0) {
        lVar12 = 0;
        std::
        __inplace_stable_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<Omega_h::CompareKeySets<int,2>>>
                  ((int *)pvVar8,(int *)((long)pvVar8 + (long)iVar11 * 4),__comp_02);
      }
      else {
        std::
        __stable_sort_adaptive<int*,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<Omega_h::CompareKeySets<int,2>>>
                  ((int *)pvVar8,(int *)((long)pvVar8 + (long)iVar11 * 4),piVar6,lVar12,__comp_02);
      }
      operator_delete(piVar6,lVar12 << 2);
    }
    plVar3 = profile::global_singleton_history;
    if (profile::global_singleton_history != (long *)0x0) {
      dVar1 = *(double *)
               (*profile::global_singleton_history + 0x30 +
               profile::global_singleton_history[3] * 0x40);
      NVar7 = now();
      RVar13 = operator-(NVar7,(Impl)((Impl *)(*plVar3 + 0x28 + plVar3[3] * 0x40))->__d);
      lVar12 = *plVar3;
      lVar2 = plVar3[3];
      *(double *)(lVar12 + 0x30 + lVar2 * 0x40) = dVar1 + RVar13;
      plVar3[3] = *(long *)(lVar12 + lVar2 * 0x40);
      plVar3 = profile::global_singleton_history;
      if (profile::global_singleton_history != (long *)0x0) {
        dVar1 = *(double *)
                 (*profile::global_singleton_history + 0x30 +
                 profile::global_singleton_history[3] * 0x40);
        NVar7 = now();
        RVar13 = operator-(NVar7,(Impl)((Impl *)(*plVar3 + 0x28 + plVar3[3] * 0x40))->__d);
        lVar12 = *plVar3;
        lVar2 = plVar3[3];
        *(double *)(lVar12 + 0x30 + lVar2 * 0x40) = dVar1 + RVar13;
        plVar3[3] = *(long *)(lVar12 + lVar2 * 0x40);
      }
    }
    local_90._M_dataplus._M_p = (pointer)local_a8.shared_alloc_.alloc;
    local_90._M_string_length = (size_type)local_a8.shared_alloc_.direct_ptr;
    if ((((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
         local_a8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_a8.shared_alloc_.alloc)->use_count = (local_a8.shared_alloc_.alloc)->use_count + -1;
      local_90._M_dataplus._M_p = (pointer)((local_a8.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_a8.shared_alloc_.alloc = (Alloc *)0x0;
    local_a8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<int>::Read((Read<signed_char> *)this,(Write<int> *)&local_90);
    _Var5._M_p = local_90._M_dataplus._M_p;
    pvVar8 = extraout_RDX_05;
    if (((ulong)local_90._M_dataplus._M_p & 7) == 0 &&
        (Alloc *)local_90._M_dataplus._M_p != (Alloc *)0x0) {
      piVar6 = (int *)(local_90._M_dataplus._M_p + 0x30);
      *piVar6 = *piVar6 + -1;
      if (*piVar6 == 0) {
        Alloc::~Alloc((Alloc *)local_90._M_dataplus._M_p);
        operator_delete(_Var5._M_p,0x48);
        pvVar8 = extraout_RDX_06;
      }
    }
    pAVar4 = local_a8.shared_alloc_.alloc;
    this_00 = local_50;
    if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
        local_a8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar6 = &(local_a8.shared_alloc_.alloc)->use_count;
      *piVar6 = *piVar6 + -1;
      if (*piVar6 == 0) {
        Alloc::~Alloc(local_a8.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
        pvVar8 = extraout_RDX_07;
        this_00 = local_50;
      }
    }
    break;
  case 3:
    local_60 = (keys->write_).shared_alloc_.alloc;
    if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_60 = (Alloc *)(local_60->size * 8 + 1);
      }
      else {
        local_60->use_count = local_60->use_count + 1;
      }
    }
    pAVar4 = local_60;
    __comp._M_comp.keys_ = (CompareKeySets<int,_3>)(keys->write_).shared_alloc_.direct_ptr;
    local_58.keys_ = (int *)__comp._M_comp.keys_;
    begin_code("sort_by_keys",(char *)0x0);
    if (((ulong)pAVar4 & 1) == 0) {
      sVar10 = pAVar4->size;
    }
    else {
      sVar10 = (ulong)pAVar4 >> 3;
    }
    iVar9 = (int)(sVar10 >> 2);
    if (0x55555554 < iVar9 * -0x55555555 + 0x2aaaaaaaU) {
      fail("assertion %s failed at %s +%d\n","a % b == 0",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
           ,0x11a);
    }
    iVar11 = iVar9 / 3;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    Write<int>::Write(&local_a8,iVar11,0,1,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    pvVar8 = local_a8.shared_alloc_.direct_ptr;
    begin_code("parallel_sort",(char *)0x0);
    if (4 < iVar9 + 2U) {
      pVar14 = std::get_temporary_buffer<int>((long)((iVar11 - (iVar11 + 1 >> 0x1f)) + 1 >> 1));
      lVar12 = pVar14.second;
      piVar6 = pVar14.first;
      if (piVar6 == (int *)0x0) {
        lVar12 = 0;
        std::
        __inplace_stable_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<Omega_h::CompareKeySets<int,3>>>
                  ((int *)pvVar8,(int *)((long)pvVar8 + (long)iVar11 * 4),__comp);
      }
      else {
        std::
        __stable_sort_adaptive<int*,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<Omega_h::CompareKeySets<int,3>>>
                  ((int *)pvVar8,(int *)((long)pvVar8 + (long)iVar11 * 4),piVar6,lVar12,__comp);
      }
      operator_delete(piVar6,lVar12 << 2);
    }
    plVar3 = profile::global_singleton_history;
    if (profile::global_singleton_history != (long *)0x0) {
      dVar1 = *(double *)
               (*profile::global_singleton_history + 0x30 +
               profile::global_singleton_history[3] * 0x40);
      NVar7 = now();
      RVar13 = operator-(NVar7,(Impl)((Impl *)(*plVar3 + 0x28 + plVar3[3] * 0x40))->__d);
      lVar12 = *plVar3;
      lVar2 = plVar3[3];
      *(double *)(lVar12 + 0x30 + lVar2 * 0x40) = dVar1 + RVar13;
      plVar3[3] = *(long *)(lVar12 + lVar2 * 0x40);
      plVar3 = profile::global_singleton_history;
      if (profile::global_singleton_history != (long *)0x0) {
        dVar1 = *(double *)
                 (*profile::global_singleton_history + 0x30 +
                 profile::global_singleton_history[3] * 0x40);
        NVar7 = now();
        RVar13 = operator-(NVar7,(Impl)((Impl *)(*plVar3 + 0x28 + plVar3[3] * 0x40))->__d);
        lVar12 = *plVar3;
        lVar2 = plVar3[3];
        *(double *)(lVar12 + 0x30 + lVar2 * 0x40) = dVar1 + RVar13;
        plVar3[3] = *(long *)(lVar12 + lVar2 * 0x40);
      }
    }
    local_90._M_dataplus._M_p = (pointer)local_a8.shared_alloc_.alloc;
    local_90._M_string_length = (size_type)local_a8.shared_alloc_.direct_ptr;
    if ((((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
         local_a8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_a8.shared_alloc_.alloc)->use_count = (local_a8.shared_alloc_.alloc)->use_count + -1;
      local_90._M_dataplus._M_p = (pointer)((local_a8.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_a8.shared_alloc_.alloc = (Alloc *)0x0;
    local_a8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<int>::Read((Read<signed_char> *)this,(Write<int> *)&local_90);
    _Var5._M_p = local_90._M_dataplus._M_p;
    pvVar8 = extraout_RDX_08;
    if (((ulong)local_90._M_dataplus._M_p & 7) == 0 &&
        (Alloc *)local_90._M_dataplus._M_p != (Alloc *)0x0) {
      piVar6 = (int *)(local_90._M_dataplus._M_p + 0x30);
      *piVar6 = *piVar6 + -1;
      if (*piVar6 == 0) {
        Alloc::~Alloc((Alloc *)local_90._M_dataplus._M_p);
        operator_delete(_Var5._M_p,0x48);
        pvVar8 = extraout_RDX_09;
      }
    }
    pAVar4 = local_a8.shared_alloc_.alloc;
    this_00 = local_60;
    if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
        local_a8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar6 = &(local_a8.shared_alloc_.alloc)->use_count;
      *piVar6 = *piVar6 + -1;
      if (*piVar6 == 0) {
        Alloc::~Alloc(local_a8.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
        pvVar8 = extraout_RDX_10;
        this_00 = local_60;
      }
    }
    break;
  case 4:
    local_70 = (keys->write_).shared_alloc_.alloc;
    if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_70 = (Alloc *)(local_70->size * 8 + 1);
      }
      else {
        local_70->use_count = local_70->use_count + 1;
      }
    }
    pAVar4 = local_70;
    __comp_00._M_comp.keys_ = (CompareKeySets<int,_4>)(keys->write_).shared_alloc_.direct_ptr;
    local_68.keys_ = (int *)__comp_00._M_comp.keys_;
    begin_code("sort_by_keys",(char *)0x0);
    if (((ulong)pAVar4 & 1) == 0) {
      sVar10 = pAVar4->size;
    }
    else {
      sVar10 = (ulong)pAVar4 >> 3;
    }
    if ((sVar10 >> 2 & 3) != 0) {
      fail("assertion %s failed at %s +%d\n","a % b == 0",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
           ,0x11a);
    }
    iVar9 = (int)(sVar10 >> 2);
    iVar11 = iVar9 >> 2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    Write<int>::Write(&local_a8,iVar11,0,1,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    pvVar8 = local_a8.shared_alloc_.direct_ptr;
    begin_code("parallel_sort",(char *)0x0);
    if (iVar9 != 0) {
      pVar14 = std::get_temporary_buffer<int>((long)((iVar11 - (iVar11 + 1 >> 0x1f)) + 1 >> 1));
      lVar12 = pVar14.second;
      piVar6 = pVar14.first;
      if (piVar6 == (int *)0x0) {
        lVar12 = 0;
        std::
        __inplace_stable_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<Omega_h::CompareKeySets<int,4>>>
                  ((int *)pvVar8,(int *)((long)pvVar8 + (long)iVar11 * 4),__comp_00);
      }
      else {
        std::
        __stable_sort_adaptive<int*,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<Omega_h::CompareKeySets<int,4>>>
                  ((int *)pvVar8,(int *)((long)pvVar8 + (long)iVar11 * 4),piVar6,lVar12,__comp_00);
      }
      operator_delete(piVar6,lVar12 << 2);
    }
    plVar3 = profile::global_singleton_history;
    if (profile::global_singleton_history != (long *)0x0) {
      dVar1 = *(double *)
               (*profile::global_singleton_history + 0x30 +
               profile::global_singleton_history[3] * 0x40);
      NVar7 = now();
      RVar13 = operator-(NVar7,(Impl)((Impl *)(*plVar3 + 0x28 + plVar3[3] * 0x40))->__d);
      lVar12 = *plVar3;
      lVar2 = plVar3[3];
      *(double *)(lVar12 + 0x30 + lVar2 * 0x40) = dVar1 + RVar13;
      plVar3[3] = *(long *)(lVar12 + lVar2 * 0x40);
      plVar3 = profile::global_singleton_history;
      if (profile::global_singleton_history != (long *)0x0) {
        dVar1 = *(double *)
                 (*profile::global_singleton_history + 0x30 +
                 profile::global_singleton_history[3] * 0x40);
        NVar7 = now();
        RVar13 = operator-(NVar7,(Impl)((Impl *)(*plVar3 + 0x28 + plVar3[3] * 0x40))->__d);
        lVar12 = *plVar3;
        lVar2 = plVar3[3];
        *(double *)(lVar12 + 0x30 + lVar2 * 0x40) = dVar1 + RVar13;
        plVar3[3] = *(long *)(lVar12 + lVar2 * 0x40);
      }
    }
    local_90._M_dataplus._M_p = (pointer)local_a8.shared_alloc_.alloc;
    local_90._M_string_length = (size_type)local_a8.shared_alloc_.direct_ptr;
    if ((((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
         local_a8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_a8.shared_alloc_.alloc)->use_count = (local_a8.shared_alloc_.alloc)->use_count + -1;
      local_90._M_dataplus._M_p = (pointer)((local_a8.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_a8.shared_alloc_.alloc = (Alloc *)0x0;
    local_a8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<int>::Read((Read<signed_char> *)this,(Write<int> *)&local_90);
    _Var5._M_p = local_90._M_dataplus._M_p;
    pvVar8 = extraout_RDX_02;
    if (((ulong)local_90._M_dataplus._M_p & 7) == 0 &&
        (Alloc *)local_90._M_dataplus._M_p != (Alloc *)0x0) {
      piVar6 = (int *)(local_90._M_dataplus._M_p + 0x30);
      *piVar6 = *piVar6 + -1;
      if (*piVar6 == 0) {
        Alloc::~Alloc((Alloc *)local_90._M_dataplus._M_p);
        operator_delete(_Var5._M_p,0x48);
        pvVar8 = extraout_RDX_03;
      }
    }
    pAVar4 = local_a8.shared_alloc_.alloc;
    this_00 = local_70;
    if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
        local_a8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar6 = &(local_a8.shared_alloc_.alloc)->use_count;
      *piVar6 = *piVar6 + -1;
      if (*piVar6 == 0) {
        Alloc::~Alloc(local_a8.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
        pvVar8 = extraout_RDX_04;
        this_00 = local_70;
      }
    }
    break;
  default:
    fail("assertion %s failed at %s +%d\n","false",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_sort.cpp"
         ,0x5b);
  }
  if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
    piVar6 = &this_00->use_count;
    *piVar6 = *piVar6 + -1;
    if (*piVar6 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
      pvVar8 = extraout_RDX_11;
    }
  }
  LVar15.write_.shared_alloc_.direct_ptr = pvVar8;
  LVar15.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar15.write_.shared_alloc_;
}

Assistant:

LOs sort_by_keys(Read<T> keys, Int width) {
  if (width == 1) return sort_by_keys_tmpl<1>(keys);
  if (width == 2) return sort_by_keys_tmpl<2>(keys);
  if (width == 3) return sort_by_keys_tmpl<3>(keys);
  if (width == 4) return sort_by_keys_tmpl<4>(keys);
  OMEGA_H_NORETURN(LOs());
}